

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_SpecifiedFieldsEmptyListAlwaysSucceeds_Test
::~MessageDifferencerTest_SpecifiedFieldsEmptyListAlwaysSucceeds_Test
          (MessageDifferencerTest_SpecifiedFieldsEmptyListAlwaysSucceeds_Test *this)

{
  MessageDifferencerTest_SpecifiedFieldsEmptyListAlwaysSucceeds_Test *this_local;
  
  ~MessageDifferencerTest_SpecifiedFieldsEmptyListAlwaysSucceeds_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, SpecifiedFieldsEmptyListAlwaysSucceeds) {
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  TestUtil::SetAllFields(&msg1);

  std::vector<const FieldDescriptor*> empty_fields;

  util::MessageDifferencer differencer;
  EXPECT_TRUE(
      differencer.CompareWithFields(msg1, msg2, empty_fields, empty_fields));

  TestUtil::SetAllFields(&msg2);
  EXPECT_TRUE(
      differencer.CompareWithFields(msg1, msg2, empty_fields, empty_fields));
}